

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O0

adt_error_t adt_bytearray_trimLeft(adt_bytearray_t *self,uint8_t *pSrc)

{
  int iVar1;
  uint uVar2;
  uint32_t remain;
  uint32_t start;
  uint8_t *pSrc_local;
  adt_bytearray_t *self_local;
  
  if ((((self == (adt_bytearray_t *)0x0) || (pSrc == (uint8_t *)0x0)) || (pSrc < self->pData)) ||
     (self->pData + self->u32CurLen < pSrc)) {
    self_local._7_1_ = '\x01';
  }
  else {
    iVar1 = (int)pSrc - (int)self->pData;
    uVar2 = self->u32CurLen - iVar1;
    if (pSrc == self->pData) {
      if (iVar1 != 0) {
        __assert_fail("start == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_bytearray.c"
                      ,199,"adt_error_t adt_bytearray_trimLeft(adt_bytearray_t *, const uint8_t *)")
        ;
      }
    }
    else if (uVar2 == 0) {
      self->u32CurLen = 0;
    }
    else {
      memmove(self->pData,pSrc,(ulong)uVar2);
      self->u32CurLen = uVar2;
    }
    self_local._7_1_ = '\0';
  }
  return self_local._7_1_;
}

Assistant:

adt_error_t adt_bytearray_trimLeft(adt_bytearray_t *self, const uint8_t *pSrc){
   if( (self!=0) && (pSrc!=0) && (self->pData <= pSrc) && (pSrc <= self->pData + self->u32CurLen) ){
      uint32_t start, remain;
      /*
       * boundary cases:
       *    pBegin = self->pData
       *    =>
       *       start = 0
       *       remain = self->u32CurLen
       *
       *    pBegin = self->pData+self->u32CurLen
       *    =>
       *       start = self->u32CurLen
       *       remain = 0
       */
      start = (uint32_t) (pSrc - self->pData);
      remain = self->u32CurLen - start;
      if(pSrc == self->pData){
         //no action
         assert(start == 0);
      }
      else if(remain == 0){
         //remove all
         self->u32CurLen = 0;
      }
      else{
         memmove(self->pData,pSrc,remain);
         self->u32CurLen = remain;
      }
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}